

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

ssh2_userkey * import_ssh2(Filename *filename,int type,char *passphrase,char **errmsg_p)

{
  LoadedFile *lf_00;
  ssh2_userkey *toret;
  LoadedFile *lf;
  char **errmsg_p_local;
  char *passphrase_local;
  int type_local;
  Filename *filename_local;
  
  lf_00 = lf_load_keyfile(filename,errmsg_p);
  if (lf_00 == (LoadedFile *)0x0) {
    filename_local = (Filename *)0x0;
  }
  else {
    filename_local = (Filename *)import_ssh2_s(lf_00->binarysource_,type,passphrase,errmsg_p);
    lf_free(lf_00);
  }
  return (ssh2_userkey *)filename_local;
}

Assistant:

ssh2_userkey *import_ssh2(const Filename *filename, int type,
                          char *passphrase, const char **errmsg_p)
{
    LoadedFile *lf = lf_load_keyfile(filename, errmsg_p);
    if (!lf)
        return false;

    ssh2_userkey *toret = import_ssh2_s(BinarySource_UPCAST(lf),
                                        type, passphrase, errmsg_p);
    lf_free(lf);
    return toret;
}